

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall
despot::MemoryPool<despot::BridgeState>::DeleteAll(MemoryPool<despot::BridgeState> *this)

{
  Chunk *this_00;
  pointer ppCVar1;
  pointer ppBVar2;
  pointer ppCVar3;
  
  for (ppCVar3 = (this->chunks_).
                 super__Vector_base<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar3 !=
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppCVar3 = ppCVar3 + 1) {
    this_00 = *ppCVar3;
    if (this_00 != (Chunk *)0x0) {
      Chunk::~Chunk(this_00);
    }
    operator_delete(this_00,0x2800);
  }
  ppCVar1 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar3 != ppCVar1) {
    (this->chunks_).
    super__Vector_base<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppCVar1;
  }
  ppBVar2 = (this->freelist_).
            super__Vector_base<despot::BridgeState_*,_std::allocator<despot::BridgeState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->freelist_).
      super__Vector_base<despot::BridgeState_*,_std::allocator<despot::BridgeState_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar2) {
    (this->freelist_).
    super__Vector_base<despot::BridgeState_*,_std::allocator<despot::BridgeState_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar2;
  }
  this->num_allocated_ = 0;
  return;
}

Assistant:

void DeleteAll() {
		for (chunk_iterator_ i_chunk = chunks_.begin();
			i_chunk != chunks_.end(); ++i_chunk)
			delete *i_chunk;
		chunks_.clear();
		freelist_.clear();
		num_allocated_ = 0;
	}